

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O0

bool __thiscall despot::util::tinyxml::TiXmlDocument::SaveFile(TiXmlDocument *this,char *filename)

{
  FILE *__stream;
  bool result;
  FILE *fp;
  char *filename_local;
  TiXmlDocument *this_local;
  
  __stream = (FILE *)TiXmlFOpen(filename,"w");
  if (__stream == (FILE *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    this_local._7_1_ = SaveFile(this,(FILE *)__stream);
    fclose(__stream);
  }
  return this_local._7_1_;
}

Assistant:

bool TiXmlDocument::SaveFile(const char * filename) const {
	// The old c stuff lives on...
	FILE* fp = TiXmlFOpen(filename, "w");
	if (fp) {
		bool result = SaveFile(fp);
		fclose(fp);
		return result;
	}
	return false;
}